

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall cmComputeLinkDepends::FollowLinkEntry(cmComputeLinkDepends *this,BFSEntry qe)

{
  bool bVar1;
  TargetType TVar2;
  reference pvVar3;
  cmLinkInterface *iface_00;
  reference item;
  int depender_index_00;
  cmLinkItem *oi;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range3;
  bool isIface;
  cmLinkInterface *iface;
  LinkEntry *entry;
  int depender_index;
  cmComputeLinkDepends *this_local;
  BFSEntry qe_local;
  
  depender_index_00 = qe.Index;
  pvVar3 = std::
           vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ::operator[](&this->EntryList,(long)depender_index_00);
  if (pvVar3->Target == (cmGeneratorTarget *)0x0) {
    AddVarLinkEntries(this,depender_index_00,qe.LibDepends);
  }
  else {
    iface_00 = cmGeneratorTarget::GetLinkInterface(pvVar3->Target,&this->Config,this->Target);
    if (iface_00 != (cmLinkInterface *)0x0) {
      TVar2 = cmGeneratorTarget::GetType(pvVar3->Target);
      AddLinkEntries<cmLinkItem>
                (this,depender_index_00,(vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface_00)
      ;
      if (TVar2 != INTERFACE_LIBRARY) {
        FollowSharedDeps(this,depender_index_00,iface_00,false);
        __end3 = std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin
                           (&iface_00->WrongConfigLibraries);
        oi = (cmLinkItem *)
             std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end
                       (&iface_00->WrongConfigLibraries);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                                           *)&oi), bVar1) {
          item = __gnu_cxx::
                 __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                 ::operator*(&__end3);
          CheckWrongConfigItem(this,item);
          __gnu_cxx::
          __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
          ::operator++(&__end3);
        }
      }
    }
  }
  return;
}

Assistant:

void cmComputeLinkDepends::FollowLinkEntry(BFSEntry qe)
{
  // Get this entry representation.
  int depender_index = qe.Index;
  LinkEntry const& entry = this->EntryList[depender_index];

  // Follow the item's dependencies.
  if (entry.Target) {
    // Follow the target dependencies.
    if (cmLinkInterface const* iface =
          entry.Target->GetLinkInterface(this->Config, this->Target)) {
      const bool isIface =
        entry.Target->GetType() == cmStateEnums::INTERFACE_LIBRARY;
      // This target provides its own link interface information.
      this->AddLinkEntries(depender_index, iface->Libraries);

      if (isIface) {
        return;
      }

      // Handle dependent shared libraries.
      this->FollowSharedDeps(depender_index, iface);

      // Support for CMP0003.
      for (cmLinkItem const& oi : iface->WrongConfigLibraries) {
        this->CheckWrongConfigItem(oi);
      }
    }
  } else {
    // Follow the old-style dependency list.
    this->AddVarLinkEntries(depender_index, qe.LibDepends);
  }
}